

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LoopStatements.cpp
# Opt level: O3

Statement *
slang::ast::ForLoopStatement::fromSyntax
          (Compilation *compilation,ForLoopStatementSyntax *syntax,ASTContext *context,
          StatementContext *stmtCtx)

{
  ExpressionKind EVar1;
  uint uVar2;
  StatementContext *pSVar3;
  Compilation *compilation_00;
  bool bVar4;
  int iVar5;
  int iVar6;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar7;
  specific_symbol_iterator<slang::ast::VariableSymbol> sVar8;
  SourceLocation this;
  undefined4 extraout_var_00;
  Expression *this_00;
  ForLoopStatement *loop;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *src_00;
  EVP_PKEY_CTX *src_01;
  size_t extraout_RDX;
  VariableSymbol *var;
  long lVar9;
  ulong uVar10;
  byte bVar11;
  subrange<slang::ast::Scope::specific_symbol_iterator<slang::ast::VariableSymbol>,_slang::ast::Scope::specific_symbol_iterator<slang::ast::VariableSymbol>,_(std::ranges::subrange_kind)0>
  sVar12;
  Expression *stopExpr;
  SmallVector<const_slang::ast::Expression_*,_5UL> steps;
  SmallVector<const_slang::ast::VariableSymbol_*,_5UL> loopVars;
  SmallVector<const_slang::ast::Expression_*,_5UL> initializers;
  Expression *local_138;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> local_130;
  StatementContext *local_120;
  Compilation *local_118;
  span<const_slang::ast::Expression_*,_18446744073709551615UL> local_110;
  undefined1 local_100 [64];
  SmallVectorBase<const_slang::ast::VariableSymbol_*> local_c0 [2];
  SmallVectorBase<const_slang::ast::Expression_*> local_80 [2];
  SourceRange local_40;
  undefined4 extraout_var;
  undefined4 extraout_var_01;
  
  local_80[0].data_ = (pointer)local_80[0].firstElement;
  bVar11 = 0;
  local_80[0].len = 0;
  local_80[0].cap = 5;
  local_c0[0].data_ = (pointer)local_c0[0].firstElement;
  local_c0[0].len = 0;
  local_c0[0].cap = 5;
  local_120 = stmtCtx;
  local_118 = compilation;
  if ((syntax->initializers).elements._M_extent._M_extent_value != 0) {
    ppSVar7 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                        ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                         (syntax->initializers).elements._M_ptr);
    if ((*ppSVar7)->kind == ForVariableDeclaration) {
      sVar12 = Scope::membersOfType<slang::ast::VariableSymbol>((context->scope).ptr);
      sVar8 = sVar12._M_begin.current;
      if (sVar8.current != sVar12._M_end.current.current) {
        do {
          local_100._0_8_ = sVar8.current;
          SmallVectorBase<slang::ast::VariableSymbol_const*>::
          emplace_back<slang::ast::VariableSymbol_const*>
                    ((SmallVectorBase<slang::ast::VariableSymbol_const*> *)local_c0,
                     (VariableSymbol **)local_100);
          do {
            sVar8.current = *(Symbol **)((long)sVar8.current + 0x28);
            if ((SourceLocation)sVar8.current == (SourceLocation)0x0) {
              sVar8.current = (Symbol *)0x0;
              break;
            }
          } while ((0x18 < *(int *)sVar8.current - 0x3cU) ||
                  ((0x1800c0fU >> (*(int *)sVar8.current - 0x3cU & 0x1f) & 1) == 0));
        } while (sVar8.current != sVar12._M_end.current.current);
      }
    }
    else {
      uVar10 = (syntax->initializers).elements._M_extent._M_extent_value + 1;
      if (1 < uVar10) {
        uVar10 = uVar10 >> 1;
        lVar9 = 0;
        bVar11 = 0;
        do {
          ppSVar7 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                              ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                               ((long)&(((syntax->initializers).elements._M_ptr)->
                                       super_ConstTokenOrSyntax).
                                       super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                       .
                                       super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                       .
                                       super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                       .
                                       super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                       .
                                       super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                               + lVar9));
          this._0_4_ = Expression::bind((int)*ppSVar7,(sockaddr *)context,8);
          this._4_4_ = extraout_var;
          local_100._0_8_ = this;
          SmallVectorBase<slang::ast::Expression_const*>::
          emplace_back<slang::ast::Expression_const*>
                    ((SmallVectorBase<slang::ast::Expression_const*> *)local_80,
                     (Expression **)local_100);
          bVar4 = Expression::bad((Expression *)this);
          bVar11 = bVar11 | bVar4;
          lVar9 = lVar9 + 0x30;
          uVar10 = uVar10 - 1;
        } while (uVar10 != 0);
        goto LAB_004468ff;
      }
    }
    bVar11 = 0;
  }
LAB_004468ff:
  local_138 = (Expression *)0x0;
  if (syntax->stopExpr != (ExpressionSyntax *)0x0) {
    iVar5 = Expression::bind((int)syntax->stopExpr,(sockaddr *)context,0);
    local_138 = (Expression *)CONCAT44(extraout_var_00,iVar5);
  }
  local_100._0_8_ = local_100 + 0x18;
  local_100._8_8_ = 0;
  local_100._16_8_ = 5;
  uVar10 = (syntax->steps).elements._M_extent._M_extent_value + 1;
  if (1 < uVar10) {
    uVar10 = uVar10 >> 1;
    lVar9 = 0;
    do {
      ppSVar7 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                          ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                           ((long)&(((syntax->steps).elements._M_ptr)->super_ConstTokenOrSyntax).
                                   super_variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Variant_base<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Copy_assign_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                                   .
                                   super__Move_ctor_alias<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*>
                           + lVar9));
      iVar5 = Expression::bind((int)*ppSVar7,(sockaddr *)context,8);
      this_00 = (Expression *)CONCAT44(extraout_var_01,iVar5);
      local_130._M_ptr = (pointer)this_00;
      SmallVectorBase<slang::ast::Expression_const*>::emplace_back<slang::ast::Expression_const*>
                ((SmallVectorBase<slang::ast::Expression_const*> *)local_100,
                 (Expression **)&local_130);
      bVar4 = Expression::bad(this_00);
      bVar11 = bVar11 | bVar4;
      EVar1 = this_00->kind;
      if ((int)EVar1 < 0xe) {
        if ((EVar1 != Invalid) && ((EVar1 != UnaryOp || (3 < this_00[1].kind - UnaryOp)))) {
LAB_004469c8:
          bVar11 = 1;
          ASTContext::addDiag(context,(DiagCode)0x250008,this_00->sourceRange);
        }
      }
      else if ((EVar1 != Assignment) && (EVar1 != Call)) goto LAB_004469c8;
      lVar9 = lVar9 + 0x30;
      uVar10 = uVar10 - 1;
    } while (uVar10 != 0);
  }
  compilation_00 = local_118;
  if ((bVar11 != 0) ||
     ((local_138 != (Expression *)0x0 && (bVar4 = Expression::bad(local_138), bVar4)))) {
    loop = (ForLoopStatement *)Statement::badStmt(compilation_00,(Statement *)0x0);
  }
  else {
    pSVar3 = local_120;
    uVar2 = (local_120->flags).m_bits;
    (local_120->flags).m_bits = uVar2 | 9;
    iVar5 = Statement::bind((int)(syntax->statement).ptr,(sockaddr *)context,(socklen_t)local_120);
    iVar6 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                      (local_80,(EVP_PKEY_CTX *)compilation_00,src);
    local_130._M_ptr = (pointer)CONCAT44(extraout_var_03,iVar6);
    iVar6 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                      ((SmallVectorBase<const_slang::ast::Expression_*> *)local_100,
                       (EVP_PKEY_CTX *)compilation_00,src_00);
    local_110._M_ptr = (pointer)CONCAT44(extraout_var_04,iVar6);
    local_40 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
    loop = BumpAllocator::
           emplace<slang::ast::ForLoopStatement,std::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::ast::Expression_const*&,std::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::ast::Statement_const&,slang::SourceRange>
                     (&compilation_00->super_BumpAllocator,&local_130,&local_138,&local_110,
                      (Statement *)CONCAT44(extraout_var_02,iVar5),&local_40);
    iVar6 = SmallVectorBase<const_slang::ast::VariableSymbol_*>::copy
                      (local_c0,(EVP_PKEY_CTX *)compilation_00,src_01);
    (loop->loopVars)._M_ptr = (pointer)CONCAT44(extraout_var_05,iVar6);
    (loop->loopVars)._M_extent._M_extent_value = extraout_RDX;
    if (((Statement *)CONCAT44(extraout_var_02,iVar5))->kind == Invalid) {
      loop = (ForLoopStatement *)Statement::badStmt(compilation_00,&loop->super_Statement);
    }
    else if ((((uVar2 & 8) == 0) && (((compilation_00->options).flags.m_bits & 0x20) == 0)) &&
            (bVar4 = Scope::isUninstantiated((context->scope).ptr), !bVar4)) {
      UnrollVisitor::run(context,loop);
    }
    (pSVar3->flags).m_bits = uVar2 & 9 | (pSVar3->flags).m_bits & 0x16;
  }
  if ((VariableSymbol *)local_100._0_8_ != (VariableSymbol *)(local_100 + 0x18)) {
    operator_delete((void *)local_100._0_8_);
  }
  if (local_c0[0].data_ != (pointer)local_c0[0].firstElement) {
    operator_delete(local_c0[0].data_);
  }
  if (local_80[0].data_ != (pointer)local_80[0].firstElement) {
    operator_delete(local_80[0].data_);
  }
  return &loop->super_Statement;
}

Assistant:

Statement& ForLoopStatement::fromSyntax(Compilation& compilation,
                                        const ForLoopStatementSyntax& syntax,
                                        const ASTContext& context, StatementContext& stmtCtx) {
    SmallVector<const Expression*> initializers;
    SmallVector<const VariableSymbol*> loopVars;
    bool anyBad = false;

    const bool hasVarDecls = !syntax.initializers.empty() &&
                             syntax.initializers[0]->kind == SyntaxKind::ForVariableDeclaration;
    if (hasVarDecls) {
        // The block should have already been created for us containing the
        // variable declarations.
        for (auto& var : context.scope->membersOfType<VariableSymbol>())
            loopVars.push_back(&var);
    }
    else {
        for (auto initializer : syntax.initializers) {
            auto& init = Expression::bind(initializer->as<ExpressionSyntax>(), context,
                                          ASTFlags::AssignmentAllowed);
            initializers.push_back(&init);
            anyBad |= init.bad();
        }
    }

    const Expression* stopExpr = nullptr;
    if (syntax.stopExpr)
        stopExpr = &Expression::bind(*syntax.stopExpr, context);

    SmallVector<const Expression*> steps;
    for (auto step : syntax.steps) {
        auto& expr = Expression::bind(*step, context, ASTFlags::AssignmentAllowed);
        steps.push_back(&expr);
        anyBad |= expr.bad();

        bool stepOk;
        switch (expr.kind) {
            case ExpressionKind::Invalid:
            case ExpressionKind::Assignment:
            case ExpressionKind::Call:
                stepOk = true;
                break;
            case ExpressionKind::UnaryOp: {
                auto op = expr.as<UnaryExpression>().op;
                stepOk = op == UnaryOperator::Preincrement || op == UnaryOperator::Postincrement ||
                         op == UnaryOperator::Predecrement || op == UnaryOperator::Postdecrement;
                break;
            }
            default:
                stepOk = false;
                break;
        }

        if (!stepOk) {
            anyBad = true;
            context.addDiag(diag::InvalidForStepExpression, expr.sourceRange);
        }
    }

    if (anyBad || (stopExpr && stopExpr->bad()))
        return badStmt(compilation, nullptr);

    // For purposes of checking for multiple drivers to variables, we want to
    // "unroll" this for loop if possible to allow finer grained checking of
    // longest static prefixes involving the loop variables(s).
    const bool wasFirst = !stmtCtx.flags.has(StatementFlags::InForLoop);
    auto guard = stmtCtx.enterLoop(true);
    auto& bodyStmt = Statement::bind(*syntax.statement, context, stmtCtx);

    auto result = compilation.emplace<ForLoopStatement>(initializers.copy(compilation), stopExpr,
                                                        steps.copy(compilation), bodyStmt,
                                                        syntax.sourceRange());
    result->loopVars = loopVars.copy(compilation);

    if (bodyStmt.bad())
        return badStmt(compilation, result);

    // If this is the top-level unrollable for loop, attempt the unrolling now.
    // If not top-level, just pop up the stack and let the parent loop handle us.
    if (wasFirst && !compilation.hasFlag(CompilationFlags::StrictDriverChecking) &&
        !context.scope->isUninstantiated()) {
        UnrollVisitor::run(context, *result);
    }

    return *result;
}